

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utglTF2ImportExport.cpp
# Opt level: O0

void __thiscall
utglTF2ImportExport_importglTF2PrimitiveModeLinesStripWithoutIndices_Test::
~utglTF2ImportExport_importglTF2PrimitiveModeLinesStripWithoutIndices_Test
          (utglTF2ImportExport_importglTF2PrimitiveModeLinesStripWithoutIndices_Test *this)

{
  utglTF2ImportExport_importglTF2PrimitiveModeLinesStripWithoutIndices_Test *this_local;
  
  ~utglTF2ImportExport_importglTF2PrimitiveModeLinesStripWithoutIndices_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utglTF2ImportExport, importglTF2PrimitiveModeLinesStripWithoutIndices) {
    Assimp::Importer importer;
    //Lines strip without indices
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_03.gltf", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 5u);

    EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mNumIndices, 2u);
    for (unsigned int i = 0; i < scene->mMeshes[0]->mNumFaces; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[i].mNumIndices, 2u);
        EXPECT_EQ(scene->mMeshes[0]->mFaces[i].mIndices[0], i);
        EXPECT_EQ(scene->mMeshes[0]->mFaces[i].mIndices[1], i + 1u);
    }
}